

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parse_line_service(parse_state *state,int nargs,char **args)

{
  byte bVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  listnode *item;
  undefined8 *puVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  
  if (nargs == 0) {
    return;
  }
  pvVar2 = state->context;
  pcVar9 = *args;
  iVar3 = lookup_keyword(pcVar9);
  switch(iVar3) {
  case 1:
    break;
  case 2:
  case 3:
  case 5:
  case 6:
  case 10:
  case 0xb:
  case 0xc:
    goto switchD_00106a41_caseD_2;
  case 4:
    if (nargs != 2) {
      pcVar9 = "class option requires a classname\n";
      goto LAB_00106db6;
    }
    *(char **)((long)pvVar2 + 0x18) = args[1];
    break;
  case 7:
    *(byte *)((long)pvVar2 + 0x20) = *(byte *)((long)pvVar2 + 0x20) | 0x10;
    break;
  case 8:
    *(byte *)((long)pvVar2 + 0x20) = *(byte *)((long)pvVar2 + 0x20) | 0x20;
    break;
  case 9:
    *(byte *)((long)pvVar2 + 0x20) = *(byte *)((long)pvVar2 + 0x20) | 1;
    break;
  case 0xd:
    if (nargs < 2) {
      pcVar9 = "group option requires a group id\n";
      goto LAB_00106db6;
    }
    if (8 < (uint)nargs) {
      parse_error(state,"group option accepts at most %d supp. groups\n",6);
      return;
    }
    uVar4 = decode_uid(args[1]);
    *(uint *)((long)pvVar2 + 0x40) = uVar4;
    for (lVar11 = 0; (ulong)(uint)nargs - 2 != lVar11; lVar11 = lVar11 + 1) {
      uVar4 = decode_uid(args[lVar11 + 2]);
      *(uint *)((long)pvVar2 + lVar11 * 4 + 0x44) = uVar4;
    }
    *(ulong *)((long)pvVar2 + 0x60) = (ulong)(nargs - 2);
    break;
  default:
    switch(iVar3) {
    case 0x12:
      if (nargs < 2) {
        pcVar9 = "keycodes option requires atleast one keycode\n";
      }
      else {
        pvVar5 = malloc((ulong)(nargs - 1U) * 4);
        *(void **)((long)pvVar2 + 0xd0) = pvVar5;
        if (pvVar5 != (void *)0x0) {
          *(uint *)((long)pvVar2 + 0xd8) = nargs - 1U;
          for (lVar11 = 0; (ulong)(uint)nargs - 1 != lVar11; lVar11 = lVar11 + 1) {
            iVar3 = atoi(args[lVar11 + 1]);
            *(int *)((long)pvVar5 + lVar11 * 4) = iVar3;
          }
          return;
        }
        pcVar9 = "could not allocate keycodes\n";
      }
      goto LAB_00106db6;
    case 0x16:
      *(byte *)((long)pvVar2 + 0x20) = *(byte *)((long)pvVar2 + 0x20) | 2;
      return;
    case 0x17:
      pcVar9 = args[1];
      uVar4 = lookup_keyword(pcVar9);
      if ((keyword_info[uVar4].flags & 2) != 0) {
        bVar1 = keyword_info[uVar4].nargs;
        if ((int)(uint)bVar1 < nargs) {
          uVar10 = nargs - 1;
          item = (listnode *)malloc((ulong)uVar10 * 8 + 0x28);
          item[1].next = (listnode *)keyword_info[uVar4].func;
          *(uint *)&item[1].prev = uVar10;
          memcpy(item + 2,args + 1,(ulong)uVar10 << 3);
          list_add_tail((listnode *)((long)pvVar2 + 0xb8),item);
          return;
        }
        pcVar8 = "argument";
        if (2 < bVar1) {
          pcVar8 = "arguments";
        }
        parse_error(state,"%s requires %d %s\n",pcVar9,(ulong)(bVar1 - 1),pcVar8);
        return;
      }
      pcVar8 = "invalid command \'%s\'\n";
      goto LAB_00106b2c;
    case 0x1a:
      if (nargs < 2) {
        pcVar9 = "setenv option requires name and value arguments\n";
        goto LAB_00106db6;
      }
      puVar6 = (undefined8 *)calloc(1,0x18);
      if (puVar6 != (undefined8 *)0x0) {
        pcVar9 = args[2];
        puVar6[1] = args[1];
        puVar6[2] = pcVar9;
        *puVar6 = *(undefined8 *)((long)pvVar2 + 0x70);
        *(undefined8 **)((long)pvVar2 + 0x70) = puVar6;
        return;
      }
      break;
    case 0x1d:
      if (nargs < 4) {
        pcVar9 = "socket option requires name, type, perm arguments\n";
        goto LAB_00106db6;
      }
      pcVar9 = args[2];
      iVar3 = strcmp(pcVar9,"dgram");
      if ((iVar3 != 0) && (iVar3 = strcmp(pcVar9,"stream"), iVar3 != 0)) {
        pcVar9 = "socket type must be \'dgram\' or \'stream\'\n";
        goto LAB_00106db6;
      }
      puVar6 = (undefined8 *)calloc(1,0x28);
      if (puVar6 != (undefined8 *)0x0) {
        puVar6[1] = args[1];
        puVar6[2] = pcVar9;
        uVar7 = strtoul(args[3],(char **)0x0,8);
        *(int *)(puVar6 + 4) = (int)uVar7;
        if (nargs != 4) {
          uVar4 = decode_uid(args[4]);
          *(uint *)(puVar6 + 3) = uVar4;
          if (5 < (uint)nargs) {
            uVar4 = decode_uid(args[5]);
            *(uint *)((long)puVar6 + 0x1c) = uVar4;
          }
        }
        *puVar6 = *(undefined8 *)((long)pvVar2 + 0x68);
        *(undefined8 **)((long)pvVar2 + 0x68) = puVar6;
        return;
      }
      break;
    default:
      if (iVar3 == 0x23) {
        if (nargs == 2) {
          uVar4 = decode_uid(args[1]);
          *(uint *)((long)pvVar2 + 0x3c) = uVar4;
          return;
        }
        pcVar9 = "user option requires a user id\n";
        goto LAB_00106db6;
      }
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x18:
    case 0x19:
    case 0x1b:
    case 0x1c:
switchD_00106a41_caseD_2:
      pcVar8 = "invalid option \'%s\'\n";
LAB_00106b2c:
      parse_error(state,pcVar8,pcVar9);
      return;
    }
    pcVar9 = "out of memory\n";
LAB_00106db6:
    parse_error(state,pcVar9);
    return;
  }
  return;
}

Assistant:

static void parse_line_service(struct parse_state *state, int nargs, char **args)
{
    struct service *svc = state->context;
    struct command *cmd;
    int i, kw, kw_nargs;

    if (nargs == 0) {
        return;
    }
    
    kw = lookup_keyword(args[0]);
    switch (kw) {
    case K_capability:
        break;
    case K_class:
        if (nargs != 2) {
            parse_error(state, "class option requires a classname\n");
        } else {
            svc->classname = args[1];
        }
        break;
    case K_console:
        svc->flags |= SVC_CONSOLE;
        break;
    case K_disabled:
        svc->flags |= SVC_DISABLED;
        break;
    case K_group:
        if (nargs < 2) {
            parse_error(state, "group option requires a group id\n");
        } else if (nargs > NR_SVC_SUPP_GIDS + 2) {
            parse_error(state, "group option accepts at most %d supp. groups\n",
                        NR_SVC_SUPP_GIDS);
        } else {
            int n;
            svc->gid = decode_uid(args[1]);
            for (n = 2; n < nargs; n++) {
                svc->supp_gids[n-2] = decode_uid(args[n]);
            }
            svc->nr_supp_gids = n - 2;
        }
        break;
    case K_keycodes:
        if (nargs < 2) {
            parse_error(state, "keycodes option requires atleast one keycode\n");
        } else {
            svc->keycodes = malloc((nargs - 1) * sizeof(svc->keycodes[0]));
            if (!svc->keycodes) {
                parse_error(state, "could not allocate keycodes\n");
            } else {
                svc->nkeycodes = nargs - 1;
                for (i = 1; i < nargs; i++) {
                    svc->keycodes[i - 1] = atoi(args[i]);
                }
            }
        }
        break;
    case K_oneshot:
        svc->flags |= SVC_ONESHOT;
        break;
    case K_onrestart:
        nargs--;
        args++;
        kw = lookup_keyword(args[0]);
        if (!kw_is(kw, COMMAND)) {
            parse_error(state, "invalid command '%s'\n", args[0]);
            break;
        }
        kw_nargs = kw_nargs(kw);
        if (nargs < kw_nargs) {
            parse_error(state, "%s requires %d %s\n", args[0], kw_nargs - 1,
                kw_nargs > 2 ? "arguments" : "argument");
            break;
        }

        cmd = malloc(sizeof(*cmd) + sizeof(char*) * nargs);
        cmd->func = kw_func(kw);
        cmd->nargs = nargs;
        memcpy(cmd->args, args, sizeof(char*) * nargs);
        list_add_tail(&svc->onrestart.commands, &cmd->clist);
        break;
    case K_critical:
        svc->flags |= SVC_CRITICAL;
        break;
    case K_setenv: { /* name value */
        struct svcenvinfo *ei;
        if (nargs < 2) {
            parse_error(state, "setenv option requires name and value arguments\n");
            break;
        }
        ei = calloc(1, sizeof(*ei));
        if (!ei) {
            parse_error(state, "out of memory\n");
            break;
        }
        ei->name = args[1];
        ei->value = args[2];
        ei->next = svc->envvars;
        svc->envvars = ei;
        break;
    }
    case K_socket: {/* name type perm [ uid gid ] */
        struct socketinfo *si;
        if (nargs < 4) {
            parse_error(state, "socket option requires name, type, perm arguments\n");
            break;
        }
        if (strcmp(args[2],"dgram") && strcmp(args[2],"stream")) {
            parse_error(state, "socket type must be 'dgram' or 'stream'\n");
            break;
        }
        si = calloc(1, sizeof(*si));
        if (!si) {
            parse_error(state, "out of memory\n");
            break;
        }
        si->name = args[1];
        si->type = args[2];
        si->perm = strtoul(args[3], 0, 8);
        if (nargs > 4)
            si->uid = decode_uid(args[4]);
        if (nargs > 5)
            si->gid = decode_uid(args[5]);
        si->next = svc->sockets;
        svc->sockets = si;
        break;
    }
    case K_user:
        if (nargs != 2) {
            parse_error(state, "user option requires a user id\n");
        } else {
            svc->uid = decode_uid(args[1]);
        }
        break;
    default:
        parse_error(state, "invalid option '%s'\n", args[0]);
    }
}